

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::closeEvent(QMessageBox *this,QCloseEvent *e)

{
  QMessageBoxPrivate *this_00;
  QEvent *in_RSI;
  QMessageBoxPrivate *in_RDI;
  QAbstractButton *in_stack_00000008;
  QMessageBoxPrivate *d;
  int in_stack_ffffffffffffffdc;
  QMessageBoxPrivate *this_01;
  
  this_01 = in_RDI;
  this_00 = d_func((QMessageBox *)0x7a6191);
  if (this_00->detectedEscapeButton == (QAbstractButton *)0x0) {
    QEvent::ignore(in_RSI);
  }
  else {
    QDialog::closeEvent((QDialog *)this_00,(QCloseEvent *)in_RDI);
    if (this_00->clickedButton == (QAbstractButton *)0x0) {
      this_00->clickedButton = this_00->detectedEscapeButton;
      QMessageBoxPrivate::execReturnCode(this_01,in_stack_00000008);
      QDialog::setResult((QDialog *)in_RDI,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void QMessageBox::closeEvent(QCloseEvent *e)
{
    Q_D(QMessageBox);
    if (!d->detectedEscapeButton) {
        e->ignore();
        return;
    }
    QDialog::closeEvent(e);
    if (!d->clickedButton) {
        d->clickedButton = d->detectedEscapeButton;
        setResult(d->execReturnCode(d->detectedEscapeButton));
    }
}